

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_simd_2_24_unconditional(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  float *pfVar22;
  float *pfVar23;
  uint uVar24;
  ulong uVar25;
  float *pfVar26;
  int iVar27;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar50 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar65 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [64];
  float fVar67;
  float fVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM17 [64];
  long lVar28;
  
  pfVar29 = haarResponseY;
  pfVar22 = haarResponseX;
  auVar70._32_32_ = in_ZmmResult._32_32_;
  auVar50 = vpbroadcastd_avx512vl(ZEXT416((uint)ipoint->scale));
  auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar36 = vpbroadcastd_avx512vl(ZEXT416(0x3effffff));
  auVar37 = vmovdqa64_avx512vl(auVar36);
  auVar49 = auVar50._0_16_;
  auVar37 = vpternlogd_avx512vl(auVar37,auVar49,auVar35,0xf8);
  auVar37 = vaddss_avx512f(auVar49,auVar37);
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar70._0_32_ = vpbroadcastd_avx512vl();
  auVar65._16_48_ = auVar70._16_48_;
  auVar38 = vmulss_avx512f(auVar49,auVar49);
  auVar39 = vmovdqa64_avx512vl(auVar36);
  auVar39 = vpternlogd_avx512vl(auVar39,ZEXT416((uint)ipoint->x),auVar35,0xf8);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ + ipoint->x));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40._0_8_ = (double)auVar39._0_4_;
  auVar40._8_8_ = auVar39._8_8_;
  auVar65._0_16_ = vcvtss2sd_avx512f(auVar49,auVar49);
  auVar66._0_8_ = auVar65._0_8_;
  auVar66._8_56_ = auVar65._8_56_;
  auVar40 = vfmadd231sd_fma(auVar40,auVar66._0_16_,ZEXT816(0x3fe0000000000000));
  auVar39 = vmovdqa64_avx512vl(auVar36);
  auVar39 = vpternlogd_avx512vl(auVar39,ZEXT416((uint)ipoint->y),auVar35,0xf8);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ + ipoint->y));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar41._0_8_ = (double)auVar39._0_4_;
  auVar41._8_8_ = auVar39._8_8_;
  auVar39 = vfmadd231sd_fma(auVar41,auVar66._0_16_,ZEXT816(0x3fe0000000000000));
  auVar42._0_4_ = (float)auVar39._0_8_;
  auVar42._4_12_ = auVar39._4_12_;
  auVar39._0_4_ = (int)auVar37._0_4_;
  auVar39._4_4_ = (int)auVar37._4_4_;
  auVar39._8_4_ = (int)auVar37._8_4_;
  auVar39._12_4_ = (int)auVar37._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar39);
  fVar67 = (float)auVar40._0_8_ - auVar37._0_4_;
  auVar37 = vsubss_avx512f(auVar42,auVar37);
  auVar51 = vmulps_avx512vl(auVar50,(undefined1  [32])kk0_inner_arrays_simd);
  auVar52 = vmulps_avx512vl(auVar50,(undefined1  [32])kk1_inner_arrays_simd);
  auVar53 = vmulps_avx512vl(auVar50,(undefined1  [32])kk2_inner_arrays_simd);
  auVar50._0_4_ = auVar52._0_4_ + fVar67;
  auVar50._4_4_ = auVar52._4_4_ + fVar67;
  auVar50._8_4_ = auVar52._8_4_ + fVar67;
  auVar50._12_4_ = auVar52._12_4_ + fVar67;
  auVar50._16_4_ = auVar52._16_4_ + fVar67;
  auVar50._20_4_ = auVar52._20_4_ + fVar67;
  auVar50._24_4_ = auVar52._24_4_ + fVar67;
  auVar50._28_4_ = auVar52._28_4_ + fVar67;
  auVar50 = vcvtps2dq_avx(auVar50);
  auVar52._0_4_ = auVar51._0_4_ + fVar67;
  auVar52._4_4_ = auVar51._4_4_ + fVar67;
  auVar52._8_4_ = auVar51._8_4_ + fVar67;
  auVar52._12_4_ = auVar51._12_4_ + fVar67;
  auVar52._16_4_ = auVar51._16_4_ + fVar67;
  auVar52._20_4_ = auVar51._20_4_ + fVar67;
  auVar52._24_4_ = auVar51._24_4_ + fVar67;
  auVar52._28_4_ = auVar51._28_4_ + fVar67;
  auVar51 = vcvtps2dq_avx(auVar52);
  auVar75._0_4_ = auVar53._0_4_ + fVar67;
  auVar75._4_4_ = auVar53._4_4_ + fVar67;
  auVar75._8_4_ = auVar53._8_4_ + fVar67;
  auVar75._12_4_ = auVar53._12_4_ + fVar67;
  auVar75._16_4_ = auVar53._16_4_ + fVar67;
  auVar75._20_4_ = auVar53._20_4_ + fVar67;
  auVar75._24_4_ = auVar53._24_4_ + fVar67;
  auVar75._28_4_ = auVar53._28_4_ + fVar67;
  auVar52 = vcvtps2dq_avx(auVar75);
  auVar53 = vpcmpeqd_avx2(in_ZMM13._0_32_,in_ZMM13._0_32_);
  auVar54 = vpaddd_avx512vl(auVar51,auVar53);
  auVar55 = vpaddd_avx512vl(auVar54,auVar70._0_32_);
  auVar56 = vpaddd_avx512vl(auVar55,auVar70._0_32_);
  auVar50 = vpaddd_avx2(auVar50,auVar53);
  auVar57 = vpaddd_avx512vl(auVar50,auVar70._0_32_);
  auVar58 = vpaddd_avx512vl(auVar57,auVar70._0_32_);
  auVar51 = vpaddd_avx2(auVar52,auVar53);
  auVar52 = vpaddd_avx512vl(auVar51,auVar70._0_32_);
  auVar53 = vpaddd_avx512vl(auVar52,auVar70._0_32_);
  lVar18 = 0xa0;
  iVar27 = -0xc;
  do {
    auVar43._0_4_ = (float)iVar27;
    auVar43._4_12_ = in_ZMM15._4_12_;
    auVar39 = vfmadd213ss_avx512f(auVar43,auVar49,auVar37);
    auVar40 = vmovdqa64_avx512vl(auVar36);
    auVar40 = vpternlogd_avx512vl(auVar40,auVar39,auVar35,0xf8);
    auVar39 = vaddss_avx512f(auVar39,auVar40);
    vroundss_avx(auVar39,auVar39,0xb);
    auVar39 = vcvtsi2ss_avx512f(in_ZMM17._0_16_,iVar27 + 1);
    auVar39 = vfmadd213ss_avx512f(auVar39,auVar49,auVar37);
    auVar40 = vmovdqa64_avx512vl(auVar36);
    auVar40 = vpternlogd_avx512vl(auVar40,auVar39,auVar35,0xf8);
    auVar39 = vaddss_avx512f(auVar39,auVar40);
    vroundss_avx(auVar39,auVar39,0xb);
    auVar59 = vpbroadcastd_avx512vl(ZEXT416((uint)iimage->data_width));
    auVar60 = vpbroadcastd_avx512vl();
    in_ZMM15 = ZEXT3264(auVar60);
    auVar61 = vpaddd_avx512vl(auVar60,auVar70._0_32_);
    auVar62 = vpaddd_avx512vl(auVar61,auVar70._0_32_);
    in_ZMM17 = ZEXT3264(auVar62);
    auVar63 = vpmulld_avx512vl(auVar59,auVar60);
    auVar64 = vpmulld_avx512vl(auVar59,auVar61);
    auVar59 = vpmulld_avx512vl(auVar59,auVar62);
    vpaddd_avx512vl(auVar63,auVar54);
    vpaddd_avx512vl(auVar63,auVar55);
    vpaddd_avx512vl(auVar63,auVar56);
    vpaddd_avx512vl(auVar64,auVar54);
    vpaddd_avx512vl(auVar64,auVar56);
    vpaddd_avx512vl(auVar59,auVar54);
    auVar63 = vpaddd_avx512vl(auVar59,auVar55);
    vpaddd_avx512vl(auVar59,auVar56);
    auVar75 = vpcmpeqd_avx2(auVar75,auVar75);
    auVar79 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar71 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar74 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar59 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar72 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2(auVar63,auVar63);
    auVar75 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar75);
    auVar75 = vsubps_avx(auVar75,auVar79);
    auVar59 = vsubps_avx(auVar59,auVar64);
    auVar63 = vsubps_avx(auVar71,auVar72);
    auVar64 = vsubps_avx(auVar74,auVar69);
    auVar69 = vsubps_avx(auVar75,auVar59);
    pfVar31 = (float *)((long)pfVar22 + lVar18 + -0xa0);
    *pfVar31 = auVar63._0_4_ + auVar63._0_4_ + auVar59._0_4_ + auVar75._0_4_;
    pfVar31[1] = auVar63._4_4_ + auVar63._4_4_ + auVar59._4_4_ + auVar75._4_4_;
    pfVar31[2] = auVar63._8_4_ + auVar63._8_4_ + auVar59._8_4_ + auVar75._8_4_;
    pfVar31[3] = auVar63._12_4_ + auVar63._12_4_ + auVar59._12_4_ + auVar75._12_4_;
    pfVar31[4] = auVar63._16_4_ + auVar63._16_4_ + auVar59._16_4_ + auVar75._16_4_;
    pfVar31[5] = auVar63._20_4_ + auVar63._20_4_ + auVar59._20_4_ + auVar75._20_4_;
    pfVar31[6] = auVar63._24_4_ + auVar63._24_4_ + auVar59._24_4_ + auVar75._24_4_;
    pfVar31[7] = auVar63._28_4_ + auVar63._28_4_ + auVar59._28_4_ + auVar75._28_4_;
    pfVar31 = (float *)((long)pfVar29 + lVar18 + -0xa0);
    *pfVar31 = auVar64._0_4_ + auVar64._0_4_ + auVar69._0_4_;
    pfVar31[1] = auVar64._4_4_ + auVar64._4_4_ + auVar69._4_4_;
    pfVar31[2] = auVar64._8_4_ + auVar64._8_4_ + auVar69._8_4_;
    pfVar31[3] = auVar64._12_4_ + auVar64._12_4_ + auVar69._12_4_;
    pfVar31[4] = auVar64._16_4_ + auVar64._16_4_ + auVar69._16_4_;
    pfVar31[5] = auVar64._20_4_ + auVar64._20_4_ + auVar69._20_4_;
    pfVar31[6] = auVar64._24_4_ + auVar64._24_4_ + auVar69._24_4_;
    pfVar31[7] = auVar64._28_4_ + auVar64._28_4_ + auVar69._28_4_;
    iVar1 = iimage->data_width;
    auVar63._4_4_ = iVar1;
    auVar63._0_4_ = iVar1;
    auVar63._8_4_ = iVar1;
    auVar63._12_4_ = iVar1;
    auVar63._16_4_ = iVar1;
    auVar63._20_4_ = iVar1;
    auVar63._24_4_ = iVar1;
    auVar63._28_4_ = iVar1;
    auVar71 = vpbroadcastd_avx512vl();
    auVar72 = vpaddd_avx512vl(auVar71,auVar70._0_32_);
    auVar74 = vpaddd_avx512vl(auVar72,auVar70._0_32_);
    auVar75 = vpmulld_avx512vl(auVar63,auVar71);
    auVar59 = vpmulld_avx512vl(auVar63,auVar72);
    auVar63 = vpmulld_avx512vl(auVar63,auVar74);
    vpaddd_avx512vl(auVar75,auVar54);
    vpaddd_avx512vl(auVar75,auVar55);
    vpaddd_avx2(auVar56,auVar75);
    vpaddd_avx512vl(auVar59,auVar54);
    vpaddd_avx2(auVar56,auVar59);
    vpaddd_avx512vl(auVar63,auVar54);
    vpaddd_avx512vl(auVar63,auVar55);
    vpaddd_avx2(auVar56,auVar63);
    auVar75 = vpcmpeqd_avx2(auVar79,auVar79);
    auVar78 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar79 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar59 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar75 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vsubps_avx(auVar75,auVar78);
    auVar59 = vsubps_avx(auVar59,auVar69);
    auVar63 = vsubps_avx(auVar63,auVar76);
    auVar64 = vsubps_avx(auVar64,auVar79);
    auVar69 = vsubps_avx(auVar75,auVar59);
    pfVar31 = (float *)((long)pfVar22 + lVar18 + -0x40);
    *pfVar31 = auVar63._0_4_ + auVar63._0_4_ + auVar59._0_4_ + auVar75._0_4_;
    pfVar31[1] = auVar63._4_4_ + auVar63._4_4_ + auVar59._4_4_ + auVar75._4_4_;
    pfVar31[2] = auVar63._8_4_ + auVar63._8_4_ + auVar59._8_4_ + auVar75._8_4_;
    pfVar31[3] = auVar63._12_4_ + auVar63._12_4_ + auVar59._12_4_ + auVar75._12_4_;
    pfVar31[4] = auVar63._16_4_ + auVar63._16_4_ + auVar59._16_4_ + auVar75._16_4_;
    pfVar31[5] = auVar63._20_4_ + auVar63._20_4_ + auVar59._20_4_ + auVar75._20_4_;
    pfVar31[6] = auVar63._24_4_ + auVar63._24_4_ + auVar59._24_4_ + auVar75._24_4_;
    pfVar31[7] = auVar63._28_4_ + auVar63._28_4_ + auVar59._28_4_ + auVar75._28_4_;
    pfVar31 = (float *)((long)pfVar29 + lVar18 + -0x40);
    *pfVar31 = auVar64._0_4_ + auVar64._0_4_ + auVar69._0_4_;
    pfVar31[1] = auVar64._4_4_ + auVar64._4_4_ + auVar69._4_4_;
    pfVar31[2] = auVar64._8_4_ + auVar64._8_4_ + auVar69._8_4_;
    pfVar31[3] = auVar64._12_4_ + auVar64._12_4_ + auVar69._12_4_;
    pfVar31[4] = auVar64._16_4_ + auVar64._16_4_ + auVar69._16_4_;
    pfVar31[5] = auVar64._20_4_ + auVar64._20_4_ + auVar69._20_4_;
    pfVar31[6] = auVar64._24_4_ + auVar64._24_4_ + auVar69._24_4_;
    pfVar31[7] = auVar64._28_4_ + auVar64._28_4_ + auVar69._28_4_;
    iVar1 = iimage->data_width;
    auVar64._4_4_ = iVar1;
    auVar64._0_4_ = iVar1;
    auVar64._8_4_ = iVar1;
    auVar64._12_4_ = iVar1;
    auVar64._16_4_ = iVar1;
    auVar64._20_4_ = iVar1;
    auVar64._24_4_ = iVar1;
    auVar64._28_4_ = iVar1;
    auVar75 = vpmulld_avx2(auVar64,auVar60);
    auVar59 = vpmulld_avx512vl(auVar64,auVar61);
    auVar63 = vpmulld_avx512vl(auVar64,auVar62);
    vpaddd_avx2(auVar50,auVar75);
    vpaddd_avx512vl(auVar75,auVar57);
    vpaddd_avx2(auVar58,auVar75);
    vpaddd_avx2(auVar50,auVar59);
    vpaddd_avx2(auVar58,auVar59);
    vpaddd_avx2(auVar50,auVar63);
    vpaddd_avx512vl(auVar63,auVar57);
    vpaddd_avx2(auVar58,auVar63);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar78 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar79 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar59 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar75 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vsubps_avx(auVar75,auVar78);
    auVar59 = vsubps_avx(auVar59,auVar69);
    auVar63 = vsubps_avx(auVar63,auVar76);
    auVar64 = vsubps_avx(auVar64,auVar79);
    auVar69 = vsubps_avx(auVar75,auVar59);
    pfVar31 = (float *)((long)pfVar22 + lVar18 + -0x80);
    *pfVar31 = auVar63._0_4_ + auVar63._0_4_ + auVar59._0_4_ + auVar75._0_4_;
    pfVar31[1] = auVar63._4_4_ + auVar63._4_4_ + auVar59._4_4_ + auVar75._4_4_;
    pfVar31[2] = auVar63._8_4_ + auVar63._8_4_ + auVar59._8_4_ + auVar75._8_4_;
    pfVar31[3] = auVar63._12_4_ + auVar63._12_4_ + auVar59._12_4_ + auVar75._12_4_;
    pfVar31[4] = auVar63._16_4_ + auVar63._16_4_ + auVar59._16_4_ + auVar75._16_4_;
    pfVar31[5] = auVar63._20_4_ + auVar63._20_4_ + auVar59._20_4_ + auVar75._20_4_;
    pfVar31[6] = auVar63._24_4_ + auVar63._24_4_ + auVar59._24_4_ + auVar75._24_4_;
    pfVar31[7] = auVar63._28_4_ + auVar63._28_4_ + auVar59._28_4_ + auVar75._28_4_;
    pfVar31 = (float *)((long)pfVar29 + lVar18 + -0x80);
    *pfVar31 = auVar64._0_4_ + auVar64._0_4_ + auVar69._0_4_;
    pfVar31[1] = auVar64._4_4_ + auVar64._4_4_ + auVar69._4_4_;
    pfVar31[2] = auVar64._8_4_ + auVar64._8_4_ + auVar69._8_4_;
    pfVar31[3] = auVar64._12_4_ + auVar64._12_4_ + auVar69._12_4_;
    pfVar31[4] = auVar64._16_4_ + auVar64._16_4_ + auVar69._16_4_;
    pfVar31[5] = auVar64._20_4_ + auVar64._20_4_ + auVar69._20_4_;
    pfVar31[6] = auVar64._24_4_ + auVar64._24_4_ + auVar69._24_4_;
    pfVar31[7] = auVar64._28_4_ + auVar64._28_4_ + auVar69._28_4_;
    iVar1 = iimage->data_width;
    auVar69._4_4_ = iVar1;
    auVar69._0_4_ = iVar1;
    auVar69._8_4_ = iVar1;
    auVar69._12_4_ = iVar1;
    auVar69._16_4_ = iVar1;
    auVar69._20_4_ = iVar1;
    auVar69._24_4_ = iVar1;
    auVar69._28_4_ = iVar1;
    auVar75 = vpmulld_avx512vl(auVar69,auVar71);
    auVar59 = vpmulld_avx512vl(auVar69,auVar72);
    auVar63 = vpmulld_avx512vl(auVar69,auVar74);
    vpaddd_avx2(auVar50,auVar75);
    vpaddd_avx512vl(auVar75,auVar57);
    vpaddd_avx2(auVar58,auVar75);
    vpaddd_avx2(auVar50,auVar59);
    vpaddd_avx2(auVar58,auVar59);
    vpaddd_avx2(auVar50,auVar63);
    vpaddd_avx512vl(auVar63,auVar57);
    vpaddd_avx2(auVar58,auVar63);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar78 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar79 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar59 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar75 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vsubps_avx(auVar75,auVar78);
    auVar59 = vsubps_avx(auVar59,auVar69);
    auVar63 = vsubps_avx(auVar63,auVar76);
    auVar64 = vsubps_avx(auVar64,auVar79);
    auVar69 = vsubps_avx(auVar75,auVar59);
    pfVar31 = (float *)((long)pfVar22 + lVar18 + -0x20);
    *pfVar31 = auVar63._0_4_ + auVar63._0_4_ + auVar59._0_4_ + auVar75._0_4_;
    pfVar31[1] = auVar63._4_4_ + auVar63._4_4_ + auVar59._4_4_ + auVar75._4_4_;
    pfVar31[2] = auVar63._8_4_ + auVar63._8_4_ + auVar59._8_4_ + auVar75._8_4_;
    pfVar31[3] = auVar63._12_4_ + auVar63._12_4_ + auVar59._12_4_ + auVar75._12_4_;
    pfVar31[4] = auVar63._16_4_ + auVar63._16_4_ + auVar59._16_4_ + auVar75._16_4_;
    pfVar31[5] = auVar63._20_4_ + auVar63._20_4_ + auVar59._20_4_ + auVar75._20_4_;
    pfVar31[6] = auVar63._24_4_ + auVar63._24_4_ + auVar59._24_4_ + auVar75._24_4_;
    pfVar31[7] = auVar63._28_4_ + auVar63._28_4_ + auVar59._28_4_ + auVar75._28_4_;
    pfVar31 = (float *)((long)pfVar29 + lVar18 + -0x20);
    *pfVar31 = auVar64._0_4_ + auVar64._0_4_ + auVar69._0_4_;
    pfVar31[1] = auVar64._4_4_ + auVar64._4_4_ + auVar69._4_4_;
    pfVar31[2] = auVar64._8_4_ + auVar64._8_4_ + auVar69._8_4_;
    pfVar31[3] = auVar64._12_4_ + auVar64._12_4_ + auVar69._12_4_;
    pfVar31[4] = auVar64._16_4_ + auVar64._16_4_ + auVar69._16_4_;
    pfVar31[5] = auVar64._20_4_ + auVar64._20_4_ + auVar69._20_4_;
    pfVar31[6] = auVar64._24_4_ + auVar64._24_4_ + auVar69._24_4_;
    pfVar31[7] = auVar64._28_4_ + auVar64._28_4_ + auVar69._28_4_;
    iVar1 = iimage->data_width;
    auVar79._4_4_ = iVar1;
    auVar79._0_4_ = iVar1;
    auVar79._8_4_ = iVar1;
    auVar79._12_4_ = iVar1;
    auVar79._16_4_ = iVar1;
    auVar79._20_4_ = iVar1;
    auVar79._24_4_ = iVar1;
    auVar79._28_4_ = iVar1;
    auVar75 = vpmulld_avx2(auVar79,auVar60);
    auVar59 = vpmulld_avx512vl(auVar79,auVar61);
    auVar63 = vpmulld_avx512vl(auVar79,auVar62);
    vpaddd_avx2(auVar51,auVar75);
    vpaddd_avx512vl(auVar75,auVar52);
    vpaddd_avx2(auVar53,auVar75);
    vpaddd_avx2(auVar51,auVar59);
    vpaddd_avx2(auVar53,auVar59);
    vpaddd_avx2(auVar51,auVar63);
    vpaddd_avx512vl(auVar63,auVar52);
    vpaddd_avx2(auVar53,auVar63);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar62 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar60 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar59 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar61 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar75 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vsubps_avx(auVar75,auVar62);
    auVar59 = vsubps_avx(auVar59,auVar69);
    auVar63 = vsubps_avx(auVar63,auVar61);
    auVar64 = vsubps_avx(auVar64,auVar60);
    auVar69 = vsubps_avx(auVar75,auVar59);
    pfVar31 = (float *)((long)pfVar22 + lVar18 + -0x60);
    *pfVar31 = auVar63._0_4_ + auVar63._0_4_ + auVar59._0_4_ + auVar75._0_4_;
    pfVar31[1] = auVar63._4_4_ + auVar63._4_4_ + auVar59._4_4_ + auVar75._4_4_;
    pfVar31[2] = auVar63._8_4_ + auVar63._8_4_ + auVar59._8_4_ + auVar75._8_4_;
    pfVar31[3] = auVar63._12_4_ + auVar63._12_4_ + auVar59._12_4_ + auVar75._12_4_;
    pfVar31[4] = auVar63._16_4_ + auVar63._16_4_ + auVar59._16_4_ + auVar75._16_4_;
    pfVar31[5] = auVar63._20_4_ + auVar63._20_4_ + auVar59._20_4_ + auVar75._20_4_;
    pfVar31[6] = auVar63._24_4_ + auVar63._24_4_ + auVar59._24_4_ + auVar75._24_4_;
    pfVar31[7] = auVar63._28_4_ + auVar63._28_4_ + auVar59._28_4_ + auVar75._28_4_;
    pfVar31 = (float *)((long)pfVar29 + lVar18 + -0x60);
    *pfVar31 = auVar64._0_4_ + auVar64._0_4_ + auVar69._0_4_;
    pfVar31[1] = auVar64._4_4_ + auVar64._4_4_ + auVar69._4_4_;
    pfVar31[2] = auVar64._8_4_ + auVar64._8_4_ + auVar69._8_4_;
    pfVar31[3] = auVar64._12_4_ + auVar64._12_4_ + auVar69._12_4_;
    pfVar31[4] = auVar64._16_4_ + auVar64._16_4_ + auVar69._16_4_;
    pfVar31[5] = auVar64._20_4_ + auVar64._20_4_ + auVar69._20_4_;
    pfVar31[6] = auVar64._24_4_ + auVar64._24_4_ + auVar69._24_4_;
    pfVar31[7] = auVar64._28_4_ + auVar64._28_4_ + auVar69._28_4_;
    iVar1 = iimage->data_width;
    auVar60._4_4_ = iVar1;
    auVar60._0_4_ = iVar1;
    auVar60._8_4_ = iVar1;
    auVar60._12_4_ = iVar1;
    auVar60._16_4_ = iVar1;
    auVar60._20_4_ = iVar1;
    auVar60._24_4_ = iVar1;
    auVar60._28_4_ = iVar1;
    auVar75 = vpmulld_avx512vl(auVar60,auVar71);
    auVar59 = vpmulld_avx512vl(auVar60,auVar72);
    auVar63 = vpmulld_avx512vl(auVar60,auVar74);
    vpaddd_avx2(auVar51,auVar75);
    vpaddd_avx512vl(auVar75,auVar52);
    vpaddd_avx2(auVar53,auVar75);
    vpaddd_avx2(auVar51,auVar59);
    vpaddd_avx2(auVar53,auVar59);
    vpaddd_avx2(auVar51,auVar63);
    vpaddd_avx512vl(auVar63,auVar52);
    vpaddd_avx2(auVar53,auVar63);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar62 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar60 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar69 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar61 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar75 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar75 = vgatherdps(ZEXT832(0) << 0x20,auVar75);
    auVar59 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
    auVar59 = vgatherdps(ZEXT832(0) << 0x20,auVar59);
    auVar59 = vsubps_avx(auVar59,auVar62);
    auVar63 = vsubps_avx(auVar63,auVar60);
    auVar64 = vsubps_avx(auVar64,auVar75);
    auVar69 = vsubps_avx(auVar69,auVar61);
    auVar60 = vsubps_avx(auVar59,auVar63);
    pfVar31 = (float *)((long)pfVar22 + lVar18);
    *pfVar31 = auVar64._0_4_ + auVar64._0_4_ + auVar63._0_4_ + auVar59._0_4_;
    pfVar31[1] = auVar64._4_4_ + auVar64._4_4_ + auVar63._4_4_ + auVar59._4_4_;
    pfVar31[2] = auVar64._8_4_ + auVar64._8_4_ + auVar63._8_4_ + auVar59._8_4_;
    pfVar31[3] = auVar64._12_4_ + auVar64._12_4_ + auVar63._12_4_ + auVar59._12_4_;
    pfVar31[4] = auVar64._16_4_ + auVar64._16_4_ + auVar63._16_4_ + auVar59._16_4_;
    pfVar31[5] = auVar64._20_4_ + auVar64._20_4_ + auVar63._20_4_ + auVar59._20_4_;
    pfVar31[6] = auVar64._24_4_ + auVar64._24_4_ + auVar63._24_4_ + auVar59._24_4_;
    pfVar31[7] = auVar64._28_4_ + auVar64._28_4_ + auVar63._28_4_ + auVar59._28_4_;
    pfVar31 = (float *)((long)pfVar29 + lVar18);
    *pfVar31 = auVar69._0_4_ + auVar69._0_4_ + auVar60._0_4_;
    pfVar31[1] = auVar69._4_4_ + auVar69._4_4_ + auVar60._4_4_;
    pfVar31[2] = auVar69._8_4_ + auVar69._8_4_ + auVar60._8_4_;
    pfVar31[3] = auVar69._12_4_ + auVar69._12_4_ + auVar60._12_4_;
    pfVar31[4] = auVar69._16_4_ + auVar69._16_4_ + auVar60._16_4_;
    pfVar31[5] = auVar69._20_4_ + auVar69._20_4_ + auVar60._20_4_;
    pfVar31[6] = auVar69._24_4_ + auVar69._24_4_ + auVar60._24_4_;
    pfVar31[7] = auVar69._28_4_ + auVar69._28_4_ + auVar60._28_4_;
    lVar18 = lVar18 + 0x180;
    bVar2 = iVar27 < 8;
    iVar27 = iVar27 + 4;
  } while (bVar2);
  auVar37 = vdivss_avx512f(SUB6416(ZEXT464(0xbda3d70a),0),auVar38);
  fVar68 = auVar37._0_4_;
  auVar37 = vmulss_avx512f(auVar49,ZEXT416(0x3f000000));
  auVar39 = vmovdqa64_avx512vl(auVar36);
  auVar39 = vpternlogd_avx512vl(auVar39,auVar37,auVar35,0xf8);
  auVar37 = ZEXT416((uint)(auVar37._0_4_ + auVar39._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar39 = vmulss_avx512f(auVar49,ZEXT416(0x3fc00000));
  auVar40 = vmovdqa64_avx512vl(auVar36);
  auVar40 = vpternlogd_avx512vl(auVar40,auVar39,auVar35,0xf8);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ + auVar40._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vmulss_avx512f(auVar49,ZEXT416(0x40200000));
  auVar38 = vmovdqa64_avx512vl(auVar36);
  auVar38 = vpternlogd_avx512vl(auVar38,auVar40,auVar35,0xf8);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar38._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar38 = vmulss_avx512f(auVar49,ZEXT416(0x40600000));
  auVar41 = vmovdqa64_avx512vl(auVar36);
  auVar41 = vpternlogd_avx512vl(auVar41,auVar38,auVar35,0xf8);
  auVar38 = ZEXT416((uint)(auVar38._0_4_ + auVar41._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar41 = vmulss_avx512f(auVar49,ZEXT416(0x40900000));
  auVar42 = vmovdqa64_avx512vl(auVar36);
  auVar42 = vpternlogd_avx512vl(auVar42,auVar41,auVar35,0xf8);
  auVar41 = ZEXT416((uint)(auVar42._0_4_ + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vmulss_avx512f(auVar49,ZEXT416(0x40b00000));
  auVar43 = vmovdqa64_avx512vl(auVar36);
  auVar43 = vpternlogd_avx512vl(auVar43,auVar42,auVar35,0xf8);
  auVar42 = ZEXT416((uint)(auVar42._0_4_ + auVar43._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vmulss_avx512f(auVar49,ZEXT416(0x40d00000));
  auVar44 = vmovdqa64_avx512vl(auVar36);
  auVar44 = vpternlogd_avx512vl(auVar44,auVar43,auVar35,0xf8);
  auVar43 = ZEXT416((uint)(auVar43._0_4_ + auVar44._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vmulss_avx512f(auVar49,ZEXT416(0x40f00000));
  auVar45 = vmovdqa64_avx512vl(auVar36);
  auVar45 = vpternlogd_avx512vl(auVar45,auVar44,auVar35,0xf8);
  auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar45._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vmulss_avx512f(auVar49,ZEXT416(0x41080000));
  auVar46 = vmovdqa64_avx512vl(auVar36);
  auVar46 = vpternlogd_avx512vl(auVar46,auVar45,auVar35,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vmulss_avx512f(auVar49,ZEXT416(0x41180000));
  auVar47 = vmovdqa64_avx512vl(auVar36);
  auVar47 = vpternlogd_avx512vl(auVar47,auVar46,auVar35,0xf8);
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vmulss_avx512f(auVar49,ZEXT416(0x41280000));
  auVar48 = vmovdqa64_avx512vl(auVar36);
  auVar48 = vpternlogd_avx512vl(auVar48,auVar47,auVar35,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar49 = vmulss_avx512f(auVar49,ZEXT416(0x41380000));
  auVar35 = vpternlogd_avx512vl(auVar36,auVar49,auVar35,0xf8);
  auVar35 = vaddss_avx512f(auVar49,auVar35);
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  fVar73 = auVar40._0_4_;
  fVar67 = fVar73 + auVar39._0_4_;
  fVar3 = fVar73 + auVar37._0_4_;
  fVar4 = fVar73 - auVar37._0_4_;
  fVar5 = fVar73 - auVar39._0_4_;
  fVar6 = fVar73 - auVar38._0_4_;
  fVar7 = fVar73 - auVar41._0_4_;
  fVar8 = fVar73 - auVar42._0_4_;
  fVar73 = fVar73 - auVar43._0_4_;
  fVar77 = auVar44._0_4_;
  fVar9 = fVar77 - auVar38._0_4_;
  fVar10 = fVar77 - auVar41._0_4_;
  fVar11 = fVar77 - auVar42._0_4_;
  fVar12 = fVar77 - auVar43._0_4_;
  fVar13 = fVar77 - auVar45._0_4_;
  fVar14 = fVar77 - auVar46._0_4_;
  fVar15 = fVar77 - auVar47._0_4_;
  fVar77 = fVar77 - auVar35._0_4_;
  gauss_s1_c0[0] = expf(fVar68 * fVar67 * fVar67);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar68);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar68);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar68);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar68);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar68);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar68);
  gauss_s1_c0[8] = expf(fVar73 * fVar73 * fVar68);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar68);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar68);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar68);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar68);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar68);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar68);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar68);
  gauss_s1_c1[8] = expf(fVar77 * fVar77 * fVar68);
  uVar25 = 0xfffffff8;
  lVar18 = 0;
  fVar67 = 0.0;
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  lVar28 = 0;
  pfVar22 = haarResponseX;
  pfVar29 = haarResponseY;
  do {
    uVar24 = (uint)uVar25;
    pfVar31 = gauss_s1_c0;
    if (uVar24 == 7) {
      pfVar31 = gauss_s1_c1;
    }
    if (uVar24 == 0xfffffff8) {
      pfVar31 = gauss_s1_c1;
    }
    lVar18 = (long)(int)lVar18;
    iVar27 = (int)lVar28;
    lVar28 = (long)iVar27;
    uVar21 = 0;
    uVar20 = 0xfffffff8;
    pfVar23 = pfVar22;
    pfVar30 = pfVar29;
    do {
      pfVar26 = gauss_s1_c0;
      if (uVar20 == 7) {
        pfVar26 = gauss_s1_c1;
      }
      if (uVar20 == 0xfffffff8) {
        pfVar26 = gauss_s1_c1;
      }
      uVar19 = (ulong)(uVar20 >> 0x1c & 0xfffffff8);
      auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar16 = uVar21;
      pfVar32 = pfVar30;
      pfVar33 = pfVar23;
      do {
        lVar17 = 0;
        pfVar34 = (float *)((long)pfVar31 + (ulong)(uint)((int)(uVar25 >> 0x1f) << 5));
        do {
          fVar3 = pfVar26[uVar19] * *pfVar34;
          auVar39 = vinsertps_avx(ZEXT416((uint)pfVar32[lVar17]),ZEXT416((uint)pfVar33[lVar17]),0x10
                                 );
          auVar36._0_4_ = fVar3 * auVar39._0_4_;
          auVar36._4_4_ = fVar3 * auVar39._4_4_;
          auVar36._8_4_ = fVar3 * auVar39._8_4_;
          auVar36._12_4_ = fVar3 * auVar39._12_4_;
          auVar39 = vandps_avx(auVar36,auVar37);
          auVar39 = vmovlhps_avx(auVar36,auVar39);
          auVar35._0_4_ = auVar70._0_4_ + auVar39._0_4_;
          auVar35._4_4_ = auVar70._4_4_ + auVar39._4_4_;
          auVar35._8_4_ = auVar70._8_4_ + auVar39._8_4_;
          auVar35._12_4_ = auVar70._12_4_ + auVar39._12_4_;
          auVar70 = ZEXT1664(auVar35);
          pfVar34 = pfVar34 + (ulong)(~uVar24 >> 0x1f) * 2 + -1;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        uVar16 = uVar16 + 0x18;
        uVar19 = uVar19 + (ulong)(-1 < (int)uVar20) * 2 + -1;
        pfVar33 = pfVar33 + 0x18;
        pfVar32 = pfVar32 + 0x18;
      } while (uVar16 < uVar20 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar28];
      auVar38._4_4_ = fVar3;
      auVar38._0_4_ = fVar3;
      auVar38._8_4_ = fVar3;
      auVar38._12_4_ = fVar3;
      auVar35 = vmulps_avx512vl(auVar35,auVar38);
      lVar28 = lVar28 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar18) = auVar35;
      auVar49._0_4_ = auVar35._0_4_ * auVar35._0_4_;
      auVar49._4_4_ = auVar35._4_4_ * auVar35._4_4_;
      auVar49._8_4_ = auVar35._8_4_ * auVar35._8_4_;
      auVar49._12_4_ = auVar35._12_4_ * auVar35._12_4_;
      auVar39 = vmovshdup_avx(auVar49);
      auVar40 = vfmadd231ss_fma(auVar39,auVar35,auVar35);
      auVar39 = vshufpd_avx(auVar35,auVar35,1);
      auVar40 = vfmadd213ss_fma(auVar39,auVar39,auVar40);
      auVar39 = vshufps_avx(auVar35,auVar35,0xff);
      auVar39 = vfmadd213ss_fma(auVar39,auVar39,auVar40);
      fVar67 = fVar67 + auVar39._0_4_;
      lVar18 = lVar18 + 4;
      uVar20 = uVar20 + 5;
      uVar21 = uVar21 + 0x78;
      pfVar23 = pfVar23 + 0x78;
      pfVar30 = pfVar30 + 0x78;
    } while (iVar27 + 4 != (int)lVar28);
    pfVar22 = pfVar22 + 5;
    pfVar29 = pfVar29 + 5;
    uVar25 = (ulong)(uVar24 + 5);
  } while ((int)uVar24 < 3);
  if (fVar67 < 0.0) {
    fVar67 = sqrtf(fVar67);
  }
  else {
    auVar37 = vsqrtss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
    fVar67 = auVar37._0_4_;
  }
  auVar70 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar67)));
  lVar18 = 0;
  do {
    auVar66 = vmulps_avx512f(auVar70,*(undefined1 (*) [64])(ipoint->descriptor + lVar18));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar18) = auVar66;
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_simd_2_24_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
   
        __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
        __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
        __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

        __m256 ipoint_x_sub_int_scale_vec = _mm256_set1_ps((float) ipoint_x_sub_int_scale);

        // USE CVTTPS_EPI32 FOR TRUNCATION!!!
        __m256i sample_col1 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks1));
        __m256i sample_col0 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks0));
        __m256i sample_col2 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks2));

        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {

            int l_count1 = l_count + 1;

            int sample_y_sub_int_scale0 = (int) roundf(ipoint_y_sub_int_scale + l * scale);
            int sample_y_sub_int_scale1 = (int) roundf(ipoint_y_sub_int_scale + (l+1) * scale);  

            __m256i sample_y_sub_int_scale_vec0 = _mm256_set1_epi32(sample_y_sub_int_scale0);
            __m256i sample_y_sub_int_scale_vec1 = _mm256_set1_epi32(sample_y_sub_int_scale1);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col0, int_scale_vec, &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col0, int_scale_vec, &haarResponseX[l_count1*24+0], &haarResponseY[l_count1*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col1, int_scale_vec, &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col1, int_scale_vec, &haarResponseX[l_count1*24+8], &haarResponseY[l_count1*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col2, int_scale_vec, &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col2, int_scale_vec, &haarResponseX[l_count1*24+16], &haarResponseY[l_count1*24+16]);
        }



    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}